

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive_tester.cc
# Opt level: O0

void re2::EgrepTest(int maxatoms,int maxops,string *alphabet,int maxstrlen,string *stralphabet,
                   string *wrapper)

{
  char *pcVar1;
  StringPiece *ops;
  undefined4 in_register_0000000c;
  StringPiece *s;
  allocator local_101;
  string local_100 [32];
  StringPiece local_e0;
  StringPiece local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  StringPiece local_98;
  StringPiece local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  int local_5c;
  char *pcStack_58;
  int i;
  char *tops [4];
  string *wrapper_local;
  string *stralphabet_local;
  int maxstrlen_local;
  string *alphabet_local;
  int maxops_local;
  int maxatoms_local;
  
  pcStack_58 = "";
  tops[0] = "^(?:%s)";
  tops[1] = "(?:%s)$";
  tops[2] = "^(?:%s)$";
  s = (StringPiece *)CONCAT44(in_register_0000000c,maxstrlen);
  for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
    StringPiece::StringPiece(&local_88,"");
    StringPiece::StringPiece(&local_98,alphabet);
    Split_abi_cxx11_(&local_78,(re2 *)&local_88,&local_98,s);
    ops = (StringPiece *)RegexpGenerator::EgrepOps_abi_cxx11_();
    StringPiece::StringPiece(&local_d0,"");
    StringPiece::StringPiece(&local_e0,stralphabet);
    Split_abi_cxx11_(&local_c0,(re2 *)&local_d0,&local_e0,s);
    pcVar1 = tops[(long)local_5c + -1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,pcVar1,&local_101);
    ExhaustiveTest(maxatoms,maxops,&local_78,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)ops,maxstrlen,&local_c0,wrapper,(string *)local_100);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
    s = ops;
  }
  return;
}

Assistant:

void EgrepTest(int maxatoms, int maxops, const string& alphabet,
               int maxstrlen, const string& stralphabet,
               const string& wrapper) {
  const char* tops[] = { "", "^(?:%s)", "(?:%s)$", "^(?:%s)$" };

  for (int i = 0; i < arraysize(tops); i++) {
    ExhaustiveTest(maxatoms, maxops,
                   Split("", alphabet),
                   RegexpGenerator::EgrepOps(),
                   maxstrlen,
                   Split("", stralphabet),
                   wrapper,
                   tops[i]);
  }
}